

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O3

void __thiscall
Fl_PostScript_Graphics_Driver::page
          (Fl_PostScript_Graphics_Driver *this,double pw,double ph,int media)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  FILE *__stream;
  uint uVar4;
  char *pcVar5;
  
  if (this->nPages == 0) {
    uVar2 = 1;
  }
  else {
    fwrite("CR\nGR\nGR\nGR\nSP\nrestore\n",0x17,1,(FILE *)this->output);
    uVar2 = (ulong)(this->nPages + 1);
  }
  this->nPages = (int)uVar2;
  fprintf((FILE *)this->output,"%%%%Page: %i %i\n",uVar2);
  uVar4 = (uint)ph;
  uVar3 = uVar4;
  if (ph < pw) {
    uVar3 = (int)pw;
  }
  uVar1 = (int)pw;
  if (ph < pw) {
    uVar1 = uVar4;
  }
  pcVar5 = "%%%%PageOrientation: Portrait\n";
  if (ph < pw) {
    pcVar5 = "%%%%PageOrientation: Landscape\n";
  }
  fprintf((FILE *)this->output,"%%%%PageBoundingBox: 0 0 %d %d\n",(ulong)uVar1,(ulong)uVar3);
  fprintf((FILE *)this->output,pcVar5);
  fprintf((FILE *)this->output,"%%%%BeginPageSetup\n");
  if ((((uint)media >> 0xc & 1) != 0) && (1 < this->lang_level_)) {
    fprintf((FILE *)this->output,"<< /PageSize [%i %i] /Orientation %i>> setpagedevice\n",
            (ulong)(uint)(int)(pw + 0.5),(ulong)(uint)(int)(ph + 0.5),(ulong)((uint)media >> 8 & 2))
    ;
  }
  fprintf((FILE *)this->output,"%%%%EndPageSetup\n");
  this->gap_ = 1;
  this->clip_ = (Clip *)0x0;
  (this->super_Fl_Graphics_Driver).font_ = 0;
  (this->super_Fl_Graphics_Driver).size_ = 0xc;
  this->linewidth_ = 0;
  this->linestyle_ = 0;
  this->cr_ = '\0';
  this->cg_ = '\0';
  this->cb_ = '\0';
  this->linedash_[0] = '\0';
  fwrite("save\n",5,1,(FILE *)this->output);
  fwrite("GS\n",3,1,(FILE *)this->output);
  clocale_printf(this,"%g %g TR\n",0,this->ph_);
  fwrite("1 -1 SC\n",8,1,(FILE *)this->output);
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[5])(this,0,0,0);
  fwrite("GS\n",3,1,(FILE *)this->output);
  if (((byte)((uint)media >> 0xc) & 1 < this->lang_level_) == 0) {
    if (pw <= ph) {
      if (((uint)media >> 9 & 1) == 0) goto LAB_00202896;
      uVar3 = (uint)-pw;
      __stream = (FILE *)this->output;
      uVar4 = (uint)-ph;
      pcVar5 = "180 rotate %i %i translate\n";
    }
    else {
      __stream = (FILE *)this->output;
      if (((uint)media >> 9 & 1) != 0) {
        fprintf(__stream,"-90 rotate %i 0 translate\n",(ulong)(uint)(int)-pw);
        goto LAB_00202896;
      }
      uVar3 = (int)(pw - ph);
      if (this->lang_level_ != 2) {
        uVar3 = 0;
      }
      pcVar5 = "90 rotate -%i -%i translate\n";
    }
    fprintf(__stream,pcVar5,(ulong)uVar3,(ulong)uVar4);
  }
LAB_00202896:
  fwrite("GS\nCS\n",6,1,(FILE *)this->output);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::page(double pw, double ph, int media) {
  
  if (nPages){
    fprintf(output, "CR\nGR\nGR\nGR\nSP\nrestore\n");
  }
  ++nPages;
  fprintf(output, "%%%%Page: %i %i\n" , nPages , nPages);
  fprintf(output, "%%%%PageBoundingBox: 0 0 %d %d\n", pw > ph ? (int)ph : (int)pw , pw > ph ? (int)pw : (int)ph);
  if (pw>ph){
    fprintf(output, "%%%%PageOrientation: Landscape\n");
  }else{
    fprintf(output, "%%%%PageOrientation: Portrait\n");
  }
  
  fprintf(output, "%%%%BeginPageSetup\n");
  if((media & Fl_Paged_Device::MEDIA) &&(lang_level_>1)){
    int r = media & Fl_Paged_Device::REVERSED;
    if(r) r = 2;
    fprintf(output, "<< /PageSize [%i %i] /Orientation %i>> setpagedevice\n", (int)(pw+.5), (int)(ph+.5), r);
  }
  fprintf(output, "%%%%EndPageSetup\n");
  
/*  pw_ = pw;
  ph_ = ph;*/
  reset();
  
  fprintf(output, "save\n");
  fprintf(output, "GS\n");
  clocale_printf( "%g %g TR\n", (double)0 /*lm_*/ , ph_ /* - tm_*/);
  fprintf(output, "1 -1 SC\n");
  line_style(0);
  fprintf(output, "GS\n");
  
  if (!((media & Fl_Paged_Device::MEDIA) &&(lang_level_>1))){
    if (pw > ph) {
      if(media & Fl_Paged_Device::REVERSED) {
        fprintf(output, "-90 rotate %i 0 translate\n", int(-pw));
	}
      else {
        fprintf(output, "90 rotate -%i -%i translate\n", (lang_level_ == 2 ? int(pw - ph) : 0), int(ph));
	}
      }
      else {
	if(media & Fl_Paged_Device::REVERSED)
	  fprintf(output, "180 rotate %i %i translate\n", int(-pw), int(-ph));
	}
  }
  fprintf(output, "GS\nCS\n");
}